

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O2

ArrayView<char> __thiscall
Corrade::Containers::arrayAppend<char,Corrade::Containers::ArrayMallocAllocator<char>>
          (Containers *this,Array<char,_void_(*)(char_*,_unsigned_long)> *array,type values)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  Array<char,_void_(*)(char_*,_unsigned_long)> *__src;
  ArrayView<char> AVar5;
  
  AVar5._size = values._data;
  lVar1 = *(long *)this;
  if (*(code **)(this + 0x10) == ArrayMallocAllocator<char>::deleter) {
    uVar3 = *(long *)(lVar1 + -8) - 8;
  }
  else {
    uVar3 = *(ulong *)(this + 8);
  }
  AVar5._data = Implementation::arrayGrowBy<char,Corrade::Containers::ArrayMallocAllocator<char>>
                          ((Array<char,_void_(*)(char_*,_unsigned_long)> *)this,(size_t)AVar5._size)
  ;
  if (AVar5._size != (char *)0x0) {
    uVar2 = (long)array - lVar1;
    uVar4 = 0xffffffffffffffff;
    if (uVar2 < uVar3) {
      uVar4 = uVar2;
    }
    __src = (Array<char,_void_(*)(char_*,_unsigned_long)> *)(uVar4 + *(long *)this);
    if (uVar3 <= uVar2) {
      __src = array;
    }
    memcpy(AVar5._data,__src,(size_t)AVar5._size);
  }
  return AVar5;
}

Assistant:

inline ArrayView<T> arrayAppend(Array<T>& array, const typename std::common_type<ArrayView<const T>>::type values) {
    /* Direct access & caching to speed up debug builds */
    const T* const valueData = values.data();
    const std::size_t valueCount = values.size();

    /* If the values are actually a slice of the original array, we need to
       relocate the view after growing because it may point to a stale location
       afterwards. If the offset is outside of the [0, capacity) range of the
       original array, we don't relocate. Similar check is in arrayInsert(),
       where it additionally has to adjust the offset based on whether the
       values are before or after the insertion point. */
    std::size_t relocateOffset = std::size_t(valueData - array.data());
    if(relocateOffset >= arrayCapacity<T, Allocator>(array))
        relocateOffset = ~std::size_t{};

    T* const it = Implementation::arrayGrowBy<T, Allocator>(array, valueCount);
    Implementation::arrayCopyConstruct<T>(
        /* If values were a slice of the original array, relocate the view
           pointer relative to the (potentially reallocated) array. It may have
           pointed into the (potentially uninitialized) capacity, in which case
           we'll likely copy some garbage or we overwrite ourselves, but that's
           the user fault (and ASan would catch it). OTOH, if the capacity
           wouldn't be taken into account above, we may end up reading from
           freed memory, which is far worse. */
        relocateOffset != ~std::size_t{} ? array.data() + relocateOffset :
            valueData,
        it, valueCount);
    return {it, valueCount};
}